

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kron.hpp
# Opt level: O0

SquareMatrix<std::complex<double>_> __thiscall
qclab::dense::kron<std::complex<double>>
          (dense *this,SquareMatrix<std::complex<double>_> *A,SquareMatrix<std::complex<double>_> *B
          )

{
  int64_t iVar1;
  int64_t iVar2;
  data_type extraout_RDX;
  SquareMatrix<std::complex<double>_> SVar3;
  SquareMatrix<std::complex<double>_> *B_local;
  SquareMatrix<std::complex<double>_> *A_local;
  SquareMatrix<std::complex<double>_> *kronAB;
  
  iVar1 = SquareMatrix<std::complex<double>_>::rows(A);
  iVar2 = SquareMatrix<std::complex<double>_>::rows(B);
  SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)this,iVar1 * iVar2);
  kron<qclab::dense::SquareMatrix<std::complex<double>>>
            (A,B,(SquareMatrix<std::complex<double>_> *)this);
  SVar3.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  SVar3.size_ = (size_type_conflict)this;
  return SVar3;
}

Assistant:

SquareMatrix< T > kron( const SquareMatrix< T >& A ,
                            const SquareMatrix< T >& B ) {
      SquareMatrix< T > kronAB( A.rows() * B.rows() ) ;
      kron( A , B , kronAB ) ;
      return kronAB ;
    }